

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

DynamicType *
Js::PathTypeHandlerBase::CreateTypeForNewScObject
          (ScriptContext *scriptContext,DynamicType *type,PropertyIdArray *propIds,bool shareType)

{
  uint uVar1;
  Type propertyId;
  PathTypeHandlerBase *this;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DynamicType *pDVar5;
  uint i;
  ulong uVar6;
  RecyclerWeakReference<Js::DynamicType> *local_68;
  RecyclerWeakReference<Js::DynamicType> *nextTypeWeakRef;
  PathTypeSuccessorKey local_58;
  PropertyIdArray *local_50;
  uint local_44;
  ScriptContext *local_40;
  PropertyIndex local_32 [4];
  PropertyIndex propertyIndex;
  
  local_40 = scriptContext;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x775,"(scriptContext)","scriptContext");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  uVar1 = propIds->count;
  bVar3 = propIds->has__proto__;
  if (uVar1 < 0x80 && bVar3 == false) {
    if (propIds->hadDuplicates == false) {
      local_40->objectLiteralCount[uVar1] = local_40->objectLiteralCount[uVar1] + 1;
      local_44 = (uint)shareType;
      local_50 = propIds;
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        this = (PathTypeHandlerBase *)(type->typeHandler).ptr;
        propertyId = (&local_50[1].count)[uVar6];
        local_32[0] = GetPropertyIndex(this,propertyId);
        if (local_32[0] == 0xffff) {
          PathTypeSuccessorKey::PathTypeSuccessorKey
                    ((PathTypeSuccessorKey *)&nextTypeWeakRef,propertyId,ObjectSlotAttr_Default);
          bVar3 = GetSuccessor(this,(PathTypeSuccessorKey)nextTypeWeakRef,&local_68);
          if ((!bVar3) || ((local_68->super_RecyclerWeakReferenceBase).strongRef == (Type)0x0)) {
            local_40->objectLiteralPathCount = local_40->objectLiteralPathCount + 1;
          }
          PathTypeSuccessorKey::PathTypeSuccessorKey(&local_58,propertyId,ObjectSlotAttr_Default);
          type = PromoteType<true>(this,type,local_58,SUB41(local_44,0),local_40,
                                   (DynamicObject *)0x0,local_32);
        }
      }
      return type;
    }
  }
  else if (0xfffe < uVar1) {
    if (uVar1 < 0x40000000) {
      pDVar5 = SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
               CreateTypeForNewScObject(local_40,type,propIds,shareType,bVar3);
      return pDVar5;
    }
    Throw::OutOfMemory();
  }
  pDVar5 = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
           CreateTypeForNewScObject(local_40,type,propIds,shareType,bVar3);
  return pDVar5;
}

Assistant:

DynamicType* PathTypeHandlerBase::CreateTypeForNewScObject(ScriptContext* scriptContext, DynamicType* type, const Js::PropertyIdArray *propIds, bool shareType)
    {
        Assert(scriptContext);
        uint count = propIds->count;

        bool check__proto__;
        if (UsePathTypeHandlerForObjectLiteral(propIds, &check__proto__))
        {
#ifdef PROFILE_OBJECT_LITERALS
            scriptContext->objectLiteralCount[count]++;
#endif
            for (uint i = 0; i < count; i++)
            {
                PathTypeHandlerBase *pathHandler = (PathTypeHandlerBase *)PointerValue(type->typeHandler);
                Js::PropertyId propertyId = propIds->elements[i];

                PropertyIndex propertyIndex = pathHandler->GetPropertyIndex(propertyId);

                if (propertyIndex != Constants::NoSlot)
                {
                    continue;
                }

#ifdef PROFILE_OBJECT_LITERALS
                {
                    RecyclerWeakReference<DynamicType>* nextTypeWeakRef;
                    if (!pathHandler->GetSuccessor(PathTypeSuccessorKey(propertyId, ObjectSlotAttr_Default), &nextTypeWeakRef) || nextTypeWeakRef->Get() == nullptr)
                    {
                        scriptContext->objectLiteralPathCount++;
                    }
                }
#endif
                type = pathHandler->PromoteType<true>(type, PathTypeSuccessorKey(propertyId, ObjectSlotAttr_Default), shareType, scriptContext, nullptr, &propertyIndex);
            }
        }
        else if (count <= static_cast<uint>(SimpleDictionaryTypeHandler::MaxPropertyIndexSize))
        {
            type = SimpleDictionaryTypeHandler::CreateTypeForNewScObject(scriptContext, type, propIds, shareType, check__proto__);
        }
        else if (count <= static_cast<uint>(BigSimpleDictionaryTypeHandler::MaxPropertyIndexSize))
        {
            type = BigSimpleDictionaryTypeHandler::CreateTypeForNewScObject(scriptContext, type, propIds, shareType, check__proto__);
        }
        else
        {
            Throw::OutOfMemory();
        }

        return type;
    }